

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::KurtosisState,double,duckdb::KurtosisOperation<duckdb::KurtosisFlagNoBiasCorrection>>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  unsigned_long *puVar1;
  data_ptr_t pdVar2;
  ulong uVar3;
  long lVar4;
  sel_t *psVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  AggregateUnaryInput input_data;
  double local_e8;
  double dStack_e0;
  double dStack_d0;
  UnifiedVectorFormat local_78;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar2 = input->data;
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      uVar15 = 0;
      uVar14 = 0;
      do {
        puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar16 = uVar14 + 0x40;
          if (count <= uVar14 + 0x40) {
            uVar16 = count;
          }
LAB_00d3ed4f:
          lVar12 = uVar16 - uVar14;
          uVar11 = uVar14;
          if (uVar14 <= uVar16 && lVar12 != 0) {
            lVar4 = *(long *)state;
            dVar18 = *(double *)(state + 8);
            dVar21 = *(double *)(state + 0x10);
            dVar19 = *(double *)(state + 0x18);
            dStack_d0 = *(double *)(state + 0x20);
            do {
              auVar9._8_4_ = SUB84(dStack_d0,0);
              auVar9._0_8_ = dVar19;
              auVar9._12_4_ = (int)((ulong)dStack_d0 >> 0x20);
              dVar20 = *(double *)(pdVar2 + uVar14 * 8);
              dVar18 = dVar18 + dVar20;
              dVar21 = dVar21 + dVar20 * dVar20;
              dVar17 = pow(dVar20,3.0);
              dVar20 = pow(dVar20,4.0);
              dStack_d0 = auVar9._8_8_;
              dVar19 = dVar19 + dVar17;
              dStack_d0 = dStack_d0 + dVar20;
              uVar14 = uVar14 + 1;
            } while (uVar16 != uVar14);
            *(long *)state = lVar12 + lVar4;
            *(double *)(state + 8) = dVar18;
            *(double *)(state + 0x10) = dVar21;
            auVar10._8_4_ = SUB84(dStack_d0,0);
            auVar10._0_8_ = dVar19;
            auVar10._12_4_ = (int)((ulong)dStack_d0 >> 0x20);
            *(undefined1 (*) [16])(state + 0x18) = auVar10;
            uVar11 = uVar16;
          }
        }
        else {
          uVar3 = puVar1[uVar15];
          uVar16 = uVar14 + 0x40;
          if (count <= uVar14 + 0x40) {
            uVar16 = count;
          }
          if (uVar3 == 0xffffffffffffffff) goto LAB_00d3ed4f;
          uVar11 = uVar16;
          if ((uVar3 != 0) && (uVar11 = uVar14, uVar14 < uVar16)) {
            uVar13 = 0;
            do {
              if ((uVar3 >> (uVar13 & 0x3f) & 1) != 0) {
                *(long *)state = *(long *)state + 1;
                dVar19 = *(double *)(pdVar2 + uVar13 * 8 + uVar14 * 8);
                dVar18 = dVar19 * dVar19 + *(double *)(state + 0x10);
                auVar8._8_4_ = SUB84(dVar18,0);
                auVar8._0_8_ = dVar19 + *(double *)(state + 8);
                auVar8._12_4_ = (int)((ulong)dVar18 >> 0x20);
                *(undefined1 (*) [16])(state + 8) = auVar8;
                dVar18 = pow(dVar19,3.0);
                dVar19 = pow(dVar19,4.0);
                *(double *)(state + 0x18) = dVar18 + *(double *)(state + 0x18);
                *(double *)(state + 0x20) = dVar19 + *(double *)(state + 0x20);
              }
              uVar13 = uVar13 + 1;
              uVar11 = uVar16;
            } while (uVar16 - uVar14 != uVar13);
          }
        }
        uVar14 = uVar11;
        uVar15 = uVar15 + 1;
      } while (uVar15 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) {
      local_78.data = (data_ptr_t)&input->validity;
      local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)0x0;
      local_78.sel = (SelectionVector *)aggr_input_data;
      KurtosisOperation<duckdb::KurtosisFlagNoBiasCorrection>::
      ConstantOperation<double,duckdb::KurtosisState,duckdb::KurtosisOperation<duckdb::KurtosisFlagNoBiasCorrection>>
                ((KurtosisState *)state,(double *)input->data,(AggregateUnaryInput *)&local_78,count
                );
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(input,count,&local_78);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar5 = (local_78.sel)->sel_vector;
        lVar12 = *(long *)state;
        local_e8 = *(double *)(state + 8);
        dStack_e0 = *(double *)(state + 0x10);
        dVar19 = *(double *)(state + 0x18);
        dVar18 = *(double *)(state + 0x20);
        uVar15 = 0;
        do {
          uVar14 = uVar15;
          if (psVar5 != (sel_t *)0x0) {
            uVar14 = (ulong)psVar5[uVar15];
          }
          dVar21 = *(double *)(local_78.data + uVar14 * 8);
          local_e8 = local_e8 + dVar21;
          dStack_e0 = dStack_e0 + dVar21 * dVar21;
          dVar20 = pow(dVar21,3.0);
          dVar21 = pow(dVar21,4.0);
          dVar19 = dVar19 + dVar20;
          dVar18 = dVar18 + dVar21;
          uVar15 = uVar15 + 1;
        } while (count != uVar15);
        *(idx_t *)state = lVar12 + count;
        *(double *)(state + 8) = local_e8;
        *(double *)(state + 0x10) = dStack_e0;
        *(double *)(state + 0x18) = dVar19;
        *(double *)(state + 0x20) = dVar18;
      }
    }
    else if (count != 0) {
      psVar5 = (local_78.sel)->sel_vector;
      uVar15 = 0;
      do {
        uVar14 = uVar15;
        if (psVar5 != (sel_t *)0x0) {
          uVar14 = (ulong)psVar5[uVar15];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar14 >> 6]
             >> (uVar14 & 0x3f) & 1) != 0)) {
          *(long *)state = *(long *)state + 1;
          dVar19 = *(double *)(local_78.data + uVar14 * 8);
          dVar18 = dVar19 * dVar19 + *(double *)(state + 0x10);
          auVar6._8_4_ = SUB84(dVar18,0);
          auVar6._0_8_ = dVar19 + *(double *)(state + 8);
          auVar6._12_4_ = (int)((ulong)dVar18 >> 0x20);
          *(undefined1 (*) [16])(state + 8) = auVar6;
          dVar18 = pow(dVar19,3.0);
          dVar19 = pow(dVar19,4.0);
          auVar7._8_4_ = SUB84(dVar19 + *(double *)(state + 0x20),0);
          auVar7._0_8_ = dVar18 + *(double *)(state + 0x18);
          auVar7._12_4_ = (int)((ulong)(dVar19 + *(double *)(state + 0x20)) >> 0x20);
          *(undefined1 (*) [16])(state + 0x18) = auVar7;
        }
        uVar15 = uVar15 + 1;
      } while (count != uVar15);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}